

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
           *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          Scope **args_1)

{
  int iVar1;
  uint n_;
  size_t sVar2;
  group_type *pgVar3;
  value_type *pvVar4;
  size_t in_RCX;
  long in_RDX;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
  *in_RSI;
  locator *in_RDI;
  undefined8 in_stack_00000008;
  value_type *p;
  uint n;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator *this_00;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_ffffffffffffffa0;
  pow2_quadratic_prober local_38 [2];
  long local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  pow2_quadratic_prober::pow2_quadratic_prober(local_38,in_RCX);
  while( true ) {
    sVar2 = pow2_quadratic_prober::get(local_38);
    pgVar3 = table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
             ::groups((table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                       *)0x6748c0);
    iVar1 = group15<boost::unordered::detail::foa::plain_integral>::match_available
                      ((group15<boost::unordered::detail::foa::plain_integral> *)in_RDI);
    if (iVar1 != 0) break;
    group15<boost::unordered::detail::foa::plain_integral>::mark_overflow
              ((group15<boost::unordered::detail::foa::plain_integral> *)this_00,(size_t)in_RDI);
    pow2_quadratic_prober::next(local_38,*(size_t *)(local_10 + 8));
  }
  n_ = unchecked_countr_zero(0);
  pvVar4 = table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
           ::elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
                       *)0x674901);
  construct_element<slang::ast::Scope_const*const&>
            (in_RSI,pvVar4 + sVar2 * 0xf + (ulong)n_,in_stack_00000008);
  group15<boost::unordered::detail::foa::plain_integral>::set
            (in_stack_ffffffffffffffa0,(size_t)in_RSI,(size_t)this_00);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>_>
  ::table_locator(in_RDI,pgVar3 + sVar2,n_,pvVar4 + sVar2 * 0xf + (ulong)n_);
  return this_00;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }